

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::CompileFeatureKnown
          (cmMakefile *this,cmTarget *target,string *feature,string *lang,string *error)

{
  cmake *this_00;
  size_type sVar1;
  char **ppcVar2;
  ostream *poVar3;
  char *pcVar4;
  string local_208;
  string local_1e8 [32];
  string local_1c8 [32];
  ostringstream e;
  
  sVar1 = cmGeneratorExpression::Find(feature);
  if (sVar1 != 0xffffffffffffffff) {
    __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                  ,0x1055,
                  "bool cmMakefile::CompileFeatureKnown(const cmTarget *, const std::string &, std::string &, std::string *) const"
                 );
  }
  std::__cxx11::string::string(local_1c8,(string *)feature);
  ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                      (C_FEATURES + 1,CXX_FEATURES,(cmStrCmp *)local_1c8);
  std::__cxx11::string::~string(local_1c8);
  if (ppcVar2 == CXX_FEATURES) {
    std::__cxx11::string::string(local_1e8,(string *)feature);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_FEATURES + 1,C_STANDARDS,(cmStrCmp *)local_1e8);
    std::__cxx11::string::~string(local_1e8);
    if (ppcVar2 == C_STANDARDS) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      pcVar4 = "specified";
      if (error == (string *)0x0) {
        pcVar4 = "Specified";
      }
      std::operator<<((ostream *)&e,pcVar4);
      poVar3 = std::operator<<((ostream *)&e," unknown feature \"");
      poVar3 = std::operator<<(poVar3,(string *)feature);
      poVar3 = std::operator<<(poVar3,"\" for target \"");
      poVar3 = std::operator<<(poVar3,(string *)&target->Name);
      std::operator<<(poVar3,"\".");
      if (error == (string *)0x0) {
        this_00 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_208,&this->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_208);
      }
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
  }
  std::__cxx11::string::assign((char *)lang);
  return true;
}

Assistant:

bool cmMakefile::CompileFeatureKnown(cmTarget const* target,
                                     const std::string& feature,
                                     std::string& lang,
                                     std::string* error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature =
    std::find_if(cmArrayBegin(C_FEATURES) + 1, cmArrayEnd(C_FEATURES),
                 cmStrCmp(feature)) != cmArrayEnd(C_FEATURES);
  if (isCFeature) {
    lang = "C";
    return true;
  }
  bool isCxxFeature =
    std::find_if(cmArrayBegin(CXX_FEATURES) + 1, cmArrayEnd(CXX_FEATURES),
                 cmStrCmp(feature)) != cmArrayEnd(CXX_FEATURES);
  if (isCxxFeature) {
    lang = "CXX";
    return true;
  }
  std::ostringstream e;
  if (error) {
    e << "specified";
  } else {
    e << "Specified";
  }
  e << " unknown feature \"" << feature << "\" for "
                                           "target \""
    << target->GetName() << "\".";
  if (error) {
    *error = e.str();
  } else {
    this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                           this->Backtrace);
  }
  return false;
}